

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O2

int get_byte(j_decompress_ptr cinfo)

{
  jpeg_source_mgr *pjVar1;
  jpeg_error_mgr *pjVar2;
  byte *pbVar3;
  boolean bVar4;
  
  pjVar1 = cinfo->src;
  if (pjVar1->bytes_in_buffer == 0) {
    bVar4 = (*pjVar1->fill_input_buffer)(cinfo);
    if (bVar4 == 0) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x19;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
  }
  pjVar1->bytes_in_buffer = pjVar1->bytes_in_buffer - 1;
  pbVar3 = pjVar1->next_input_byte;
  pjVar1->next_input_byte = pbVar3 + 1;
  return (int)*pbVar3;
}

Assistant:

LOCAL(int)
get_byte (j_decompress_ptr cinfo)
/* Read next input byte; we do not support suspension in this module. */
{
  struct jpeg_source_mgr * src = cinfo->src;

  if (src->bytes_in_buffer == 0)
    if (! (*src->fill_input_buffer) (cinfo))
      ERREXIT(cinfo, JERR_CANT_SUSPEND);
  src->bytes_in_buffer--;
  return GETJOCTET(*src->next_input_byte++);
}